

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

float3 * __thiscall
ConvexDecomposition::Array<ConvexDecomposition::float3>::Add
          (Array<ConvexDecomposition::float3> *this,float3 t)

{
  float3 *pfVar1;
  undefined8 uVar2;
  int iVar3;
  float3 *pfVar4;
  int s;
  undefined1 auVar5 [64];
  
  auVar5._8_56_ = t._8_56_;
  auVar5._0_8_ = t._0_8_;
  iVar3 = this->array_size;
  if (this->count <= iVar3) {
    if (this->count == iVar3) {
      s = 0x10;
      if (iVar3 != 0) {
        s = iVar3 * 2;
      }
      allocate(this,s);
    }
    pfVar4 = this->element;
    iVar3 = this->count;
    this->count = iVar3 + 1;
    pfVar1 = pfVar4 + iVar3;
    uVar2 = vmovlps_avx(auVar5._0_16_);
    pfVar1->x = (float)(int)uVar2;
    pfVar1->y = (float)(int)((ulong)uVar2 >> 0x20);
    pfVar4[iVar3].z = t.z;
    return this->element + (long)this->count + -1;
  }
  __assert_fail("count<=array_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x5e8,
                "Type &ConvexDecomposition::Array<ConvexDecomposition::float3>::Add(Type) [Type = ConvexDecomposition::float3]"
               );
}

Assistant:

Type& Array<Type>::Add(Type t)
{
	assert(count<=array_size);
	if(count==array_size)
	{
		allocate((array_size)?array_size *2:16);
	}
	element[count++] = t;
	return element[count-1];
}